

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolynomialFDS.cpp
# Opt level: O2

vector<ComponentData,_std::allocator<ComponentData>_> *
computeComponentsAndCycles
          (vector<ComponentData,_std::allocator<ComponentData>_> *__return_storage_ptr__,
          vector<long,_std::allocator<long>_> *stateSpace)

{
  pointer pCVar1;
  pointer plVar2;
  long lVar3;
  pointer pCVar4;
  ulong *puVar5;
  ulong uVar6;
  long i;
  ulong uVar7;
  ulong uVar8;
  long j_1;
  long lVar9;
  long pt;
  vector<long,_std::allocator<long>_> limitCycles;
  vector<long,_std::allocator<long>_> cycle;
  ulong local_78;
  ulong local_70;
  _Vector_base<long,_std::allocator<long>_> local_68;
  _Vector_base<long,_std::allocator<long>_> local_48;
  
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0xffffffffffffffff;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)&local_48,
             (long)(stateSpace->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(stateSpace->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3,(value_type_conflict3 *)&local_68,
             (allocator_type *)&local_78);
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar9 = 0;
  for (uVar7 = 0;
      plVar2 = (stateSpace->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar7 < (ulong)((long)(stateSpace->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)plVar2 >> 3);
      uVar7 = uVar7 + 1) {
    uVar6 = uVar7;
    if (local_48._M_impl.super__Vector_impl_data._M_start[uVar7] < 0) {
      for (; lVar3 = local_48._M_impl.super__Vector_impl_data._M_start[uVar6], lVar3 == -1;
          uVar6 = plVar2[uVar6]) {
        local_48._M_impl.super__Vector_impl_data._M_start[uVar6] = lVar9;
      }
      uVar8 = uVar7;
      local_78 = uVar6;
      if (lVar3 == lVar9) {
        std::vector<long,_std::allocator<long>_>::push_back
                  ((vector<long,_std::allocator<long>_> *)&local_68,
                   (value_type_conflict3 *)&local_78);
        lVar9 = lVar9 + 1;
      }
      else {
        for (; uVar8 != uVar6; uVar8 = plVar2[uVar8]) {
          local_48._M_impl.super__Vector_impl_data._M_start[uVar8] = lVar3;
        }
      }
    }
  }
  std::vector<ComponentData,_std::allocator<ComponentData>_>::vector
            (__return_storage_ptr__,
             (long)local_68._M_impl.super__Vector_impl_data._M_finish -
             (long)local_68._M_impl.super__Vector_impl_data._M_start >> 3,
             (allocator_type *)&local_78);
  pCVar4 = (__return_storage_ptr__->
           super__Vector_base<ComponentData,_std::allocator<ComponentData>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar9 = 0;
      (long)local_48._M_impl.super__Vector_impl_data._M_finish -
      (long)local_48._M_impl.super__Vector_impl_data._M_start >> 3 != lVar9; lVar9 = lVar9 + 1) {
    pCVar1 = pCVar4 + local_48._M_impl.super__Vector_impl_data._M_start[lVar9];
    pCVar1->componentSize = pCVar1->componentSize + 1;
  }
  for (uVar7 = 0;
      uVar7 < (ulong)((long)local_68._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_68._M_impl.super__Vector_impl_data._M_start >> 3);
      uVar7 = uVar7 + 1) {
    local_78 = local_68._M_impl.super__Vector_impl_data._M_start[uVar7];
    std::vector<long,_std::allocator<long>_>::push_back
              (&(__return_storage_ptr__->
                super__Vector_base<ComponentData,_std::allocator<ComponentData>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar7].limitCycle,(value_type_conflict3 *)&local_78
              );
    puVar5 = (ulong *)((stateSpace->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                       super__Vector_impl_data._M_start + local_78);
    while (local_70 = *puVar5, local_70 != local_78) {
      std::vector<long,_std::allocator<long>_>::push_back
                (&(__return_storage_ptr__->
                  super__Vector_base<ComponentData,_std::allocator<ComponentData>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar7].limitCycle,
                 (value_type_conflict3 *)&local_70);
      puVar5 = (ulong *)((stateSpace->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                         super__Vector_impl_data._M_start + local_70);
    }
  }
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_68);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::vector<ComponentData> computeComponentsAndCycles(const std::vector<long>& stateSpace)
{
  // cycle[0..N-1] starts out with all -1's, and then each -1 is eventually replaced with the
  //   index of the limit cycle that state goes to (N = stateSpace.size()
  std::vector<long> cycle(stateSpace.size(), -1);

  // A growing array, the length is the number of limit cycles found so far
  std::vector<long> limitCycles; // limitCycles[i] is a state in the i-th limit cycle.

  long nextIndex = 0;
  for (long i = 0; i < stateSpace.size(); ++i)
    {
      if (cycle[i] >= 0) continue;
      long pt = i;
      while (cycle[pt] == -1)
        {
          cycle[pt] = nextIndex;
          pt = stateSpace[pt];
        }
      if (cycle[pt] == nextIndex)
        {
          limitCycles.push_back(pt);
          nextIndex++; // note nextIndex is always limitCycles.size() (as a long).
        }
      else
        {
          long thisLimtCycle = cycle[pt];
          long j = i;
          while (j != pt)
            {
              cycle[j] = thisLimtCycle;
              j = stateSpace[j];
            }
        }
    }

  // This contains the component info, and each limit cycle
  std::vector<ComponentData> result(limitCycles.size());

  // fill in the component sizes of each component
  for (long i = 0; i < cycle.size(); ++i)
    {
      result[cycle[i]].componentSize++;
    }

  for (long j = 0; j < limitCycles.size(); j++)
    {
      long pt = limitCycles[j];
      result[j].limitCycle.push_back(pt);
      long q = stateSpace[pt];
      while (q != pt)
        {
          result[j].limitCycle.push_back(q);
          q = stateSpace[q];
        }
    }
  return result;
}